

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

int __thiscall QList<QGraphicsScene_*>::remove(QList<QGraphicsScene_*> *this,char *__filename)

{
  QList<QGraphicsScene_*> *extraout_RAX;
  long in_RDX;
  qsizetype in_stack_00000010;
  QGraphicsScene **in_stack_00000018;
  QPodArrayOps<QGraphicsScene_*> *in_stack_00000020;
  QArrayDataPointer<QGraphicsScene_*> *in_stack_ffffffffffffffd8;
  
  if (in_RDX != 0) {
    QArrayDataPointer<QGraphicsScene_*>::detach(&this->d,in_stack_ffffffffffffffd8);
    QArrayDataPointer<QGraphicsScene_*>::operator->(&this->d);
    QArrayDataPointer<QGraphicsScene_*>::operator->(&this->d);
    QArrayDataPointer<QGraphicsScene_*>::begin((QArrayDataPointer<QGraphicsScene_*> *)0xa006c9);
    QtPrivate::QPodArrayOps<QGraphicsScene_*>::erase
              (in_stack_00000020,in_stack_00000018,in_stack_00000010);
    this = extraout_RAX;
  }
  return (int)this;
}

Assistant:

inline void QList<T>::remove(qsizetype i, qsizetype n)
{
    Q_ASSERT_X(size_t(i) + size_t(n) <= size_t(d->size), "QList::remove", "index out of range");
    Q_ASSERT_X(n >= 0, "QList::remove", "invalid count");

    if (n == 0)
        return;

    d.detach();
    d->erase(d->begin() + i, n);
}